

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

int Jf_CutArea(Jf_Man_t *p,int *pCut,int fEdge)

{
  int iVar1;
  int local_28;
  int i;
  int Entry;
  int Ela;
  int fEdge_local;
  int *pCut_local;
  Jf_Man_t *p_local;
  
  Vec_IntClear(p->vTemp);
  if (fEdge == 0) {
    i = Jf_CutAreaRef_rec(p,pCut);
  }
  else {
    i = Jf_CutAreaRefEdge_rec(p,pCut);
  }
  for (local_28 = 0; iVar1 = Vec_IntSize(p->vTemp), local_28 < iVar1; local_28 = local_28 + 1) {
    iVar1 = Vec_IntEntry(p->vTemp,local_28);
    Gia_ObjRefDecId(p->pGia,iVar1);
  }
  return i;
}

Assistant:

static inline int Jf_CutArea( Jf_Man_t * p, int * pCut, int fEdge )
{
    int Ela, Entry, i;
    Vec_IntClear( p->vTemp );
    if ( fEdge )
        Ela = Jf_CutAreaRefEdge_rec( p, pCut );
    else
        Ela = Jf_CutAreaRef_rec( p, pCut );
    Vec_IntForEachEntry( p->vTemp, Entry, i )
        Gia_ObjRefDecId( p->pGia, Entry );
    return Ela;
}